

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O2

int cmime_part_to_file(CMimePart_T *part,char *filename)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__s;
  size_t __size;
  char *local_28;
  char *decoded_str;
  
  local_28 = (char *)0x0;
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x16e,"int cmime_part_to_file(CMimePart_T *, char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x16f,"int cmime_part_to_file(CMimePart_T *, char *)");
  }
  pcVar3 = cmime_part_get_content_transfer_encoding(part);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = part->content;
LAB_00109de1:
    asprintf(&local_28,"%s",pcVar3);
  }
  else {
    iVar1 = my_strmatch(pcVar3,"quoted-printable");
    if (iVar1 == 0) {
      local_28 = cmime_qp_decode_text(part->content);
    }
    else {
      iVar1 = my_strmatch(pcVar3,"base64");
      pcVar3 = part->content;
      if (iVar1 != 0) goto LAB_00109de1;
      local_28 = cmime_base64_decode_string(pcVar3);
    }
  }
  __s = fopen(filename,"wb");
  pcVar3 = local_28;
  if (__s == (FILE *)0x0) {
    iVar1 = -3;
    pcVar3 = "libcmime: error opening file";
  }
  else {
    __size = strlen(local_28);
    fwrite(pcVar3,__size,1,__s);
    iVar2 = fclose(__s);
    iVar1 = 0;
    if (iVar2 == 0) goto LAB_00109e44;
    pcVar3 = "libcmime: error closing file";
    iVar1 = 0;
  }
  perror(pcVar3);
LAB_00109e44:
  free(local_28);
  return iVar1;
}

Assistant:

int cmime_part_to_file(CMimePart_T *part, char *filename) {
    int retval = 0;
    FILE *fp = NULL;
    char *encoding = NULL;
    char *decoded_str = NULL;

    // todo: extend for x-uuencode
    const char base64[] = "base64";
    const char qp[] = "quoted-printable";

    assert(part);
    assert(filename);

    // check for encodings
    encoding = cmime_part_get_content_transfer_encoding(part);

    if(encoding == NULL) {
        asprintf(&decoded_str,"%s",part->content);
    } else if (my_strmatch(encoding,qp)==0) {
        decoded_str = cmime_qp_decode_text(part->content);
    } else if (my_strmatch(encoding,base64)==0) {
        decoded_str = cmime_base64_decode_string(part->content);  
    } else {
        asprintf(&decoded_str,"%s",part->content);
    }
    fp = fopen(filename, "wb");
    if(fp != NULL) {
        fwrite(decoded_str,strlen(decoded_str),1,fp);
        if (fclose(fp)!=0)
            perror("libcmime: error closing file");   
    } else {
        perror("libcmime: error opening file");
        retval = -3; /* failed to open file */ 
    }
    // some cleanup
    // RJW: Do NOT free encoding! It's a header and will be freed later.
    // if(encoding!=NULL)
    //    free(encoding);
    if(decoded_str!=NULL)
        free(decoded_str);

    return retval;
}